

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

RepeatedFieldType *
google::protobuf::internal::RepeatedStringTypeTraits::GetDefaultRepeatedField_abi_cxx11_(void)

{
  int iVar1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *arg;
  
  if (GetDefaultRepeatedField[abi:cxx11]()::instance_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetDefaultRepeatedField[abi:cxx11]()::instance_abi_cxx11_);
    if (iVar1 != 0) {
      arg = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x18);
      (arg->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ = (void *)0x0;
      (arg->super_RepeatedPtrFieldBase).current_size_ = 0;
      (arg->super_RepeatedPtrFieldBase).capacity_proxy_ = 0;
      (arg->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
      OnShutdownRun(OnShutdownDelete<google::protobuf::RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::anon_class_1_0_00000001::__invoke,arg);
      GetDefaultRepeatedField[abi:cxx11]()::instance_abi_cxx11_ = arg;
      __cxa_guard_release(&GetDefaultRepeatedField[abi:cxx11]()::instance_abi_cxx11_);
    }
  }
  return GetDefaultRepeatedField[abi:cxx11]()::instance_abi_cxx11_;
}

Assistant:

const RepeatedStringTypeTraits::RepeatedFieldType*
RepeatedStringTypeTraits::GetDefaultRepeatedField() {
  static auto instance = OnShutdownDelete(new RepeatedFieldType);
  return instance;
}